

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void idx2::Insert<unsigned_long,idx2::chunk_meta_info>
               (iterator *It,unsigned_long *Key,chunk_meta_info *Val)

{
  byte bVar1;
  chunk_meta_info *pcVar2;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *this;
  bucket_status *pbVar3;
  byte *pbVar4;
  i64 iVar5;
  allocator *paVar6;
  i64 iVar7;
  i64 iVar8;
  allocator *paVar9;
  byte *pbVar10;
  i64 iVar11;
  byte *pbVar12;
  u64 uVar13;
  int iVar14;
  undefined4 uVar15;
  long lVar16;
  iterator local_30;
  
  *It->Key = *Key;
  pcVar2 = It->Val;
  pbVar4 = (Val->Addrs).Buffer.Data;
  iVar5 = (Val->Addrs).Buffer.Bytes;
  paVar6 = (Val->Addrs).Buffer.Alloc;
  iVar7 = (Val->Addrs).Size;
  iVar8 = (Val->Addrs).Capacity;
  paVar9 = (Val->Addrs).Alloc;
  pbVar10 = (Val->Sizes).Stream.Data;
  iVar11 = (Val->Sizes).Stream.Bytes;
  pbVar12 = (Val->Sizes).BitPtr;
  uVar13 = (Val->Sizes).BitBuf;
  iVar14 = (Val->Sizes).BitPos;
  uVar15 = *(undefined4 *)&(Val->Sizes).field_0x2c;
  (pcVar2->Sizes).Stream.Alloc = (Val->Sizes).Stream.Alloc;
  (pcVar2->Sizes).BitPtr = pbVar12;
  (pcVar2->Sizes).BitBuf = uVar13;
  (pcVar2->Sizes).BitPos = iVar14;
  *(undefined4 *)&(pcVar2->Sizes).field_0x2c = uVar15;
  (pcVar2->Addrs).Capacity = iVar8;
  (pcVar2->Addrs).Alloc = paVar9;
  (pcVar2->Sizes).Stream.Data = pbVar10;
  (pcVar2->Sizes).Stream.Bytes = iVar11;
  (pcVar2->Addrs).Buffer.Data = pbVar4;
  (pcVar2->Addrs).Buffer.Bytes = iVar5;
  (pcVar2->Addrs).Buffer.Alloc = paVar6;
  (pcVar2->Addrs).Size = iVar7;
  this = It->Ht;
  pbVar3 = this->Stats;
  pbVar3[It->Idx] = Occupied;
  lVar16 = this->Size + 1;
  this->Size = lVar16;
  bVar1 = (byte)this->LogCapacity;
  if (7L << (bVar1 & 0x3f) <= lVar16 * 10) {
    IncreaseCapacity<unsigned_long,idx2::chunk_meta_info>
              (&local_30,(idx2 *)this,(hash_table<unsigned_long,_idx2::chunk_meta_info> *)It,
               (iterator *)CONCAT71((int7)((ulong)pbVar3 >> 8),bVar1));
    It->Key = local_30.Key;
    It->Val = local_30.Val;
    It->Ht = local_30.Ht;
    It->Idx = local_30.Idx;
  }
  return;
}

Assistant:

void
Insert(typename hash_table<k, v>::iterator* It, const k& Key, const v& Val)
{
  idx2_Assert((*It) != End(*(It->Ht)));
  *(It->Key) = Key;
  *(It->Val) = Val;
  It->Ht->Stats[It->Idx] = hash_table<k, v>::Occupied;
  ++It->Ht->Size;

  if (Size(*(It->Ht)) * 10 >= Capacity(*(It->Ht)) * 7)
  {
    *(It) = IncreaseCapacity(It->Ht, *It);
  }
}